

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnoncontiguousbytedevice.cpp
# Opt level: O2

void __thiscall
QByteDeviceWrappingIoDevice::QByteDeviceWrappingIoDevice
          (QByteDeviceWrappingIoDevice *this,QNonContiguousByteDevice *bd)

{
  long in_FS_OFFSET;
  Object local_20;
  
  local_20.super_QObject.d_ptr.d = *(QObjectData **)(in_FS_OFFSET + 0x28);
  QIODevice::QIODevice((QIODevice *)this,(QObject *)0x0);
  *(undefined ***)this = &PTR_metaObject_006619f0;
  *(QNonContiguousByteDevice **)(this + 0x10) = bd;
  QObject::connect<void(QNonContiguousByteDevice::*)(),void(QIODevice::*)()>
            (&local_20,(offset_in_QNonContiguousByteDevice_to_subr)bd,
             (ContextType *)QNonContiguousByteDevice::readyRead,(offset_in_QIODevice_to_subr *)0x0,
             (ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)&local_20);
  (**(code **)(*(long *)this + 0x68))(this,1);
  if (*(QObjectData **)(in_FS_OFFSET + 0x28) == local_20.super_QObject.d_ptr.d) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QByteDeviceWrappingIoDevice::QByteDeviceWrappingIoDevice(QNonContiguousByteDevice *bd)
    : QIODevice(nullptr), byteDevice(bd)
{
    connect(bd, &QNonContiguousByteDevice::readyRead, this, &QIODevice::readyRead);

    open(ReadOnly);
}